

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QString * fileArchitecture(QString *__return_storage_ptr__,Options *options,QString *path)

{
  Span *pSVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  Data *pDVar6;
  QArrayData *pQVar7;
  QArrayData ***pppQVar8;
  char cVar9;
  char *pcVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QAnyStringView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  const_iterator cVar16;
  char buffer [512];
  QString local_308;
  QString local_2f0;
  QString local_2d8;
  QString local_2b8;
  QString local_298;
  QByteArray local_278;
  QArrayData *local_258;
  QArrayData ***pppQStack_250;
  size_t sStack_248;
  QArrayData **local_238;
  QByteArray *local_230;
  undefined8 local_228;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_298.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_298.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  architectureFromName(&local_298,path);
  if ((undefined1 *)local_298.d.size == (undefined1 *)0x0) {
    local_2b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_2b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_2b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    llvmReadobjPath(&local_2b8,options);
    cVar9 = QFile::exists((QString *)&local_2b8);
    if (cVar9 == '\0') {
      fileArchitecture();
    }
    else {
      shellQuote(&local_2f0,&local_2b8);
      shellQuote(&local_308,path);
      sStack_248 = local_2f0.d.size | 0x8000000000000000;
      local_238 = &local_258;
      local_258 = (QArrayData *)CONCAT71(local_258._1_7_,1);
      pppQStack_250 = (QArrayData ***)local_2f0.d.ptr;
      local_278.d.size = local_308.d.size | 0x8000000000000000;
      local_230 = &local_278;
      local_278.d.d = (Data *)CONCAT71(local_278.d.d._1_7_,1);
      local_278.d.ptr = (char *)local_308.d.ptr;
      local_228 = 0;
      QVar12.m_size = (size_t)"%1 --needed-libs %2";
      QVar12.field_0.m_data = &local_2d8;
      QtPrivate::argToQString(QVar12,0x4000000000000013,(ArgBase **)0x2);
      pcVar5 = local_2b8.d.ptr;
      pDVar4 = local_2b8.d.d;
      qVar3 = local_2d8.d.size;
      pDVar2 = local_2d8.d.d;
      local_2d8.d.d = local_2b8.d.d;
      local_2b8.d.d = pDVar2;
      local_2b8.d.ptr = local_2d8.d.ptr;
      local_2d8.d.ptr = pcVar5;
      local_2d8.d.size = local_2b8.d.size;
      local_2b8.d.size = qVar3;
      if ((FILE *)pDVar4 != (FILE *)0x0) {
        LOCK();
        *(int *)&pDVar4->super_QArrayData = *(int *)&pDVar4->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&pDVar4->super_QArrayData == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
        }
      }
      if (&(local_308.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_308.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_308.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_308.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_308.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_2f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_2f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_2f0.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_2d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      openProcess(&local_2d8);
      pDVar2 = local_2d8.d.d;
      if ((FILE *)local_2d8.d.d == (FILE *)0x0) {
        fileArchitecture();
      }
      else {
        memset(&local_238,0xaa,0x200);
        pcVar10 = fgets((char *)&local_238,0x200,(FILE *)pDVar2);
        if (pcVar10 != (char *)0x0) {
          do {
            sStack_248 = strlen((char *)&local_238);
            local_258 = (QArrayData *)0x0;
            pppQStack_250 = &local_238;
            QByteArray::trimmed_helper(&local_278);
            pppQVar8 = pppQStack_250;
            pQVar7 = local_258;
            qVar3 = local_278.d.size;
            pDVar6 = local_278.d.d;
            local_278.d.d = (Data *)local_258;
            local_258 = &pDVar6->super_QArrayData;
            pppQStack_250 = (QArrayData ***)local_278.d.ptr;
            local_278.d.ptr = (char *)pppQVar8;
            local_278.d.size = sStack_248;
            sStack_248 = qVar3;
            if (pQVar7 != (QArrayData *)0x0) {
              LOCK();
              (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar7,1,0x10);
              }
            }
            QVar13.m_data = (storage_type_conflict *)pppQStack_250;
            QVar13.m_size = sStack_248;
            QVar15.m_data = "Arch: ";
            QVar15.m_size = 6;
            cVar9 = QtPrivate::startsWith(QVar13,QVar15);
            if (cVar9 != '\0') {
              QByteArray::mid((longlong)&local_278,(longlong)&local_258);
              cVar16 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                                 (&elfArchitectures,&local_278);
              if (&(local_278.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_278.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_278.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (cVar16.i.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 &&
                  cVar16.i.bucket == 0) {
                (__return_storage_ptr__->d).d = (Data *)0x0;
                (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                (__return_storage_ptr__->d).size = 0;
              }
              else {
                pSVar1 = (cVar16.i.d)->spans;
                uVar11 = cVar16.i.bucket >> 7;
                QVar14.m_data =
                     *(storage_type_conflict **)
                      (((pSVar1[uVar11].entries)->storage).data +
                      (ulong)((uint)pSVar1[uVar11].offsets[(uint)cVar16.i.bucket & 0x7f] * 0x30) +
                      0x28);
                QVar14.m_size = (qsizetype)__return_storage_ptr__;
                QString::fromLatin1(QVar14);
              }
              if (local_258 != (QArrayData *)0x0) {
                LOCK();
                (local_258->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_258->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_258->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_258,1,0x10);
                }
              }
              goto LAB_0010c7ad;
            }
            if (local_258 != (QArrayData *)0x0) {
              LOCK();
              (local_258->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_258->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_258->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_258,1,0x10);
              }
            }
            pcVar10 = fgets((char *)&local_238,0x200,(FILE *)local_2d8.d.d);
          } while (pcVar10 != (char *)0x0);
        }
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
LAB_0010c7ad:
      if ((FILE *)local_2d8.d.d != (FILE *)0x0) {
        pclose((FILE *)local_2d8.d.d);
      }
    }
    if ((FILE *)local_2b8.d.d != (FILE *)0x0) {
      LOCK();
      *(int *)&(local_2b8.d.d)->super_QArrayData = *(int *)&(local_2b8.d.d)->super_QArrayData + -1;
      UNLOCK();
      if (*(int *)&(local_2b8.d.d)->super_QArrayData == 0) {
        QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_298.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_298.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_298.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    (__return_storage_ptr__->d).d = local_298.d.d;
    (__return_storage_ptr__->d).ptr = local_298.d.ptr;
    (__return_storage_ptr__->d).size = local_298.d.size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString fileArchitecture(const Options &options, const QString &path)
{
    auto arch = architectureFromName(path);
    if (!arch.isEmpty())
        return arch;

    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return {};
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(path));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return {};
    }

    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        line = line.trimmed();
        if (line.startsWith("Arch: ")) {
            auto it = elfArchitectures.find(line.mid(6));
            return it != elfArchitectures.constEnd() ? QString::fromLatin1(it.value()) : QString{};
        }
    }
    return {};
}